

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O1

void __thiscall pbrt::ThreadPool::ForEachThread(ThreadPool *this,function<void_()> *func)

{
  undefined8 *puVar1;
  int iVar2;
  undefined8 *local_68;
  function<void_()> *pfStack_60;
  code *pcStack_58;
  code *pcStack_50;
  _Any_data local_48;
  code *pcStack_38;
  code *pcStack_30;
  
  puVar1 = (undefined8 *)operator_new(0x60);
  iVar2 = (int)((ulong)((long)(this->threads).
                              super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->threads).
                             super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3) + 1;
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  std::condition_variable::condition_variable((condition_variable *)(puVar1 + 5));
  *(int *)(puVar1 + 0xb) = iVar2;
  *(int *)((long)puVar1 + 0x5c) = iVar2;
  pcStack_50 = std::
               _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.cpp:177:40)>
               ::_M_invoke;
  pcStack_58 = std::
               _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.cpp:177:40)>
               ::_M_manager;
  local_48._8_8_ = 0;
  pcStack_30 = std::
               _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.h:166:29)>
               ::_M_invoke;
  pcStack_38 = std::
               _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.h:166:29)>
               ::_M_manager;
  local_68 = puVar1;
  pfStack_60 = func;
  local_48._M_unused._M_object = &local_68;
  ParallelFor(0,((long)(this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) + 1,
              (function<void_(long,_long)> *)&local_48);
  if (pcStack_38 != (code *)0x0) {
    (*pcStack_38)(&local_48,&local_48,__destroy_functor);
  }
  if (pcStack_58 != (code *)0x0) {
    (*pcStack_58)(&local_68,&local_68,3);
  }
  return;
}

Assistant:

void ThreadPool::ForEachThread(std::function<void(void)> func) {
    Barrier *barrier = new Barrier(threads.size() + 1);

    ParallelFor(0, threads.size() + 1, [barrier, &func](int64_t) {
        func();
        if (barrier->Block())
            delete barrier;
    });
}